

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPresolve.cpp
# Opt level: O1

HighsTripletListSlice * __thiscall
presolve::HPresolve::getColumnVector
          (HighsTripletListSlice *__return_storage_ptr__,HPresolve *this,HighsInt col)

{
  int iVar1;
  pointer pdVar2;
  pointer piVar3;
  
  pdVar2 = (this->Avalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar3 = (this->Anext).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  iVar1 = (this->colhead).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[col];
  (__return_storage_ptr__->super_HighsMatrixSlice<HighsTripletListSlice>).nodeIndex =
       (this->Arow).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_start;
  (__return_storage_ptr__->super_HighsMatrixSlice<HighsTripletListSlice>).nodeValue = pdVar2;
  (__return_storage_ptr__->super_HighsMatrixSlice<HighsTripletListSlice>).nodeNext = piVar3;
  (__return_storage_ptr__->super_HighsMatrixSlice<HighsTripletListSlice>).head = iVar1;
  return __return_storage_ptr__;
}

Assistant:

HighsTripletListSlice HPresolve::getColumnVector(HighsInt col) const {
  return HighsTripletListSlice(Arow.data(), Avalue.data(), Anext.data(),
                               colhead[col]);
}